

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map-test.c++
# Opt level: O0

void kj::_::(anonymous_namespace)::testEraseAll<kj::TreeMap<int,kj::StringPtr>>
               (TreeMap<int,_kj::StringPtr> *m)

{
  TreeMap<int,kj::StringPtr> *pTVar1;
  bool bVar2;
  StringPtr **ppSVar3;
  bool local_291;
  bool _kj_shouldLog_6;
  Fault local_288;
  undefined4 local_27c;
  undefined1 local_278 [16];
  char (*_kj_result_2) [7];
  undefined1 local_260 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[6]>_conflict _kjCondition_6;
  bool _kj_shouldLog_5;
  Fault local_228;
  undefined4 local_21c;
  undefined1 local_218 [16];
  char (*_kj_result_1) [7];
  undefined1 local_200 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]>_conflict _kjCondition_5;
  bool _kj_shouldLog_4;
  Fault local_1b8;
  undefined4 local_1ac;
  undefined1 local_1a8 [16];
  char (*_kj_result) [7];
  undefined1 local_190 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]>_conflict _kjCondition_4;
  undefined1 local_160 [3];
  bool _kj_shouldLog_3;
  DebugExpressionStart local_158 [8];
  undefined1 local_150 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_3;
  undefined1 local_120 [3];
  bool _kj_shouldLog_2;
  DebugExpressionStart local_118 [8];
  undefined1 local_110 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_2;
  bool _kj_shouldLog_1;
  ArrayDisposer *pAStack_e0;
  DebugExpression<unsigned_long> local_d8;
  undefined1 local_d0 [8];
  DebugComparison<unsigned_long,_int>_conflict1 _kjCondition_1;
  bool _kj_shouldLog;
  DebugExpression<unsigned_long_&> DStack_a0;
  undefined1 local_98 [8];
  DebugComparison<unsigned_long_&,_int>_conflict _kjCondition;
  size_t local_68;
  size_t count;
  StringPtr local_50;
  StringPtr local_40;
  StringPtr local_30;
  StringPtr local_20;
  TreeMap<int,kj::StringPtr> *local_10;
  TreeMap<int,_kj::StringPtr> *m_local;
  
  local_10 = (TreeMap<int,kj::StringPtr> *)m;
  StringPtr::StringPtr(&local_20,"foo");
  TreeMap<int,_kj::StringPtr>::insert(m,0xc,SUB87(local_20.content.ptr,0));
  pTVar1 = local_10;
  StringPtr::StringPtr(&local_30,"bar");
  TreeMap<int,_kj::StringPtr>::insert
            ((TreeMap<int,_kj::StringPtr> *)pTVar1,0x53,SUB87(local_30.content.ptr,0));
  pTVar1 = local_10;
  StringPtr::StringPtr(&local_40,"baz");
  TreeMap<int,_kj::StringPtr>::insert
            ((TreeMap<int,_kj::StringPtr> *)pTVar1,99,SUB87(local_40.content.ptr,0));
  pTVar1 = local_10;
  StringPtr::StringPtr(&local_50,"qux");
  TreeMap<int,_kj::StringPtr>::insert
            ((TreeMap<int,_kj::StringPtr> *)pTVar1,6,SUB87(local_50.content.ptr,0));
  pTVar1 = local_10;
  StringPtr::StringPtr((StringPtr *)&count,"corge");
  TreeMap<int,_kj::StringPtr>::insert((TreeMap<int,_kj::StringPtr> *)pTVar1,0x37,SUB87(count,0));
  local_68 = TreeMap<int,kj::StringPtr>::
             eraseAll<kj::_::(anonymous_namespace)::testEraseAll<kj::TreeMap<int,kj::StringPtr>>(kj::TreeMap<int,kj::StringPtr>&)::_lambda(int,kj::StringPtr)_1_,bool>
                       (local_10,(anon_class_1_0_00000001 *)&_kjCondition.field_0x27);
  DStack_a0 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_68);
  _kjCondition_1._36_4_ = 2;
  DebugExpression<unsigned_long&>::operator==
            ((DebugComparison<unsigned_long_&,_int> *)local_98,
             (DebugExpression<unsigned_long&> *)&stack0xffffffffffffff60,
             (int *)&_kjCondition_1.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
  if (!bVar2) {
    _kjCondition_1._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_1._35_1_ != '\0') {
      Debug::log<char_const(&)[28],kj::_::DebugComparison<unsigned_long&,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,0xc6,ERROR,"\"failed: expected \" \"count == 2\", _kjCondition",
                 (char (*) [28])"failed: expected count == 2",
                 (DebugComparison<unsigned_long_&,_int>_conflict *)local_98);
      _kjCondition_1._35_1_ = 0;
    }
  }
  pAStack_e0 = (ArrayDisposer *)
               TreeMap<int,_kj::StringPtr>::size((TreeMap<int,_kj::StringPtr> *)local_10);
  local_d8 = DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                        (unsigned_long *)&stack0xffffffffffffff20);
  _kjCondition_2._36_4_ = 3;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_d0,&local_d8,
             (int *)&_kjCondition_2.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_d0);
  if (!bVar2) {
    _kjCondition_2._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_2._35_1_ != '\0') {
      Debug::log<char_const(&)[31],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,199,ERROR,"\"failed: expected \" \"m.size() == 3\", _kjCondition",
                 (char (*) [31])"failed: expected m.size() == 3",
                 (DebugComparison<unsigned_long,_int>_conflict1 *)local_d0);
      _kjCondition_2._35_1_ = 0;
    }
  }
  _kjCondition_3._36_4_ = 0xc;
  TreeMap<int,_kj::StringPtr>::find<int>((TreeMap<int,_kj::StringPtr> *)local_120,(int *)local_10);
  DebugExpressionStart::operator<<(local_118,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_110,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_118,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_110);
  if (!bVar2) {
    _kjCondition_3._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_3._35_1_ != '\0') {
      Debug::
      log<char_const(&)[40],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,200,ERROR,"\"failed: expected \" \"m.find(12) == kj::none\", _kjCondition",
                 (char (*) [40])"failed: expected m.find(12) == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_110);
      _kjCondition_3._35_1_ = 0;
    }
  }
  _kjCondition_4._36_4_ = 99;
  TreeMap<int,_kj::StringPtr>::find<int>((TreeMap<int,_kj::StringPtr> *)local_160,(int *)local_10);
  DebugExpressionStart::operator<<(local_158,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_150,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_158,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
  if (!bVar2) {
    _kjCondition_4._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_4._35_1_ != '\0') {
      Debug::
      log<char_const(&)[40],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,0xc9,ERROR,"\"failed: expected \" \"m.find(99) == kj::none\", _kjCondition",
                 (char (*) [40])"failed: expected m.find(99) == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_150);
      _kjCondition_4._35_1_ = 0;
    }
  }
  local_1ac = 0x53;
  TreeMap<int,_kj::StringPtr>::find<int>((TreeMap<int,_kj::StringPtr> *)local_1a8,(int *)local_10);
  local_1a8._8_8_ = readMaybe<kj::StringPtr>((Maybe<kj::StringPtr_&> *)local_1a8);
  if ((StringPtr *)local_1a8._8_8_ == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_1b8,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                        ,0xca,FAILED,"m.find(83) != nullptr","");
    Debug::Fault::fatal(&local_1b8);
  }
  ppSVar3 = mv<kj::StringPtr*>((StringPtr **)(local_1a8 + 8));
  _kj_result = (char (*) [7])
               DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_190,
             (DebugExpression<kj::StringPtr&> *)&_kj_result,(char (*) [7])0x30fda1);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar2) {
    _kjCondition_5._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_5._39_1_ != '\0') {
      Debug::log<char_const(&)[56],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,0xca,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(m.find(83)) == \\\"bar\\\"\", _kjCondition"
                 ,(char (*) [56])"failed: expected KJ_ASSERT_NONNULL(m.find(83)) == \"bar\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]>_conflict *)local_190);
      _kjCondition_5._39_1_ = 0;
    }
  }
  local_21c = 6;
  TreeMap<int,_kj::StringPtr>::find<int>((TreeMap<int,_kj::StringPtr> *)local_218,(int *)local_10);
  local_218._8_8_ = readMaybe<kj::StringPtr>((Maybe<kj::StringPtr_&> *)local_218);
  if ((StringPtr *)local_218._8_8_ == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_228,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                        ,0xcb,FAILED,"m.find(6) != nullptr","");
    Debug::Fault::fatal(&local_228);
  }
  ppSVar3 = mv<kj::StringPtr*>((StringPtr **)(local_218 + 8));
  _kj_result_1 = (char (*) [7])
                 DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar3)
  ;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_200,
             (DebugExpression<kj::StringPtr&> *)&_kj_result_1,(char (*) [7])"qux");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar2) {
    _kjCondition_6._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_6._39_1_ != '\0') {
      Debug::log<char_const(&)[55],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,0xcb,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(m.find(6)) == \\\"qux\\\"\", _kjCondition"
                 ,(char (*) [55])"failed: expected KJ_ASSERT_NONNULL(m.find(6)) == \"qux\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]>_conflict *)local_200);
      _kjCondition_6._39_1_ = 0;
    }
  }
  local_27c = 0x37;
  TreeMap<int,_kj::StringPtr>::find<int>((TreeMap<int,_kj::StringPtr> *)local_278,(int *)local_10);
  local_278._8_8_ = readMaybe<kj::StringPtr>((Maybe<kj::StringPtr_&> *)local_278);
  if ((StringPtr *)local_278._8_8_ == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_288,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                        ,0xcc,FAILED,"m.find(55) != nullptr","");
    Debug::Fault::fatal(&local_288);
  }
  ppSVar3 = mv<kj::StringPtr*>((StringPtr **)(local_278 + 8));
  _kj_result_2 = (char (*) [7])
                 DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar3)
  ;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_260,
             (DebugExpression<kj::StringPtr&> *)&_kj_result_2,(char (*) [7])"corge");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_260);
  if (!bVar2) {
    local_291 = Debug::shouldLog(ERROR);
    while (local_291 != false) {
      Debug::log<char_const(&)[58],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/map-test.c++"
                 ,0xcc,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(m.find(55)) == \\\"corge\\\"\", _kjCondition"
                 ,(char (*) [58])"failed: expected KJ_ASSERT_NONNULL(m.find(55)) == \"corge\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]>_conflict *)local_260);
      local_291 = false;
    }
  }
  return;
}

Assistant:

void testEraseAll(MapType& m) {
  m.insert(12, "foo");
  m.insert(83, "bar");
  m.insert(99, "baz");
  m.insert(6, "qux");
  m.insert(55, "corge");

  auto count = m.eraseAll([](int i, StringPtr s) {
    return i == 99 || s == "foo";
  });

  KJ_EXPECT(count == 2);
  KJ_EXPECT(m.size() == 3);
  KJ_EXPECT(m.find(12) == kj::none);
  KJ_EXPECT(m.find(99) == kj::none);
  KJ_EXPECT(KJ_ASSERT_NONNULL(m.find(83)) == "bar");
  KJ_EXPECT(KJ_ASSERT_NONNULL(m.find(6)) == "qux");
  KJ_EXPECT(KJ_ASSERT_NONNULL(m.find(55)) == "corge");
}